

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall SystemError::SystemError(SystemError *this,int type)

{
  ENerror::ENerror(&this->super_ENerror);
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00153ae0;
  if ((uint)type < 0xc) {
    (this->super_ENerror).code = SystemErrorCodes[(uint)type];
    std::__cxx11::string::assign((char *)&(this->super_ENerror).msg);
  }
  return;
}

Assistant:

SystemError::SystemError(int type)
{
    if ( type >= 0 && type < SYSTEM_ERROR_LIMIT )
    {
        code = SystemErrorCodes[type];
        msg =  SystemErrorMsgs[type];
    }
}